

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O2

int mbedtls_dhm_set_group(mbedtls_dhm_context *ctx,mbedtls_mpi *P,mbedtls_mpi *G)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = -0x3080;
  if (G != (mbedtls_mpi *)0x0 && (P != (mbedtls_mpi *)0x0 && ctx != (mbedtls_dhm_context *)0x0)) {
    iVar1 = mbedtls_mpi_copy(&ctx->P,P);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&ctx->G,G), iVar1 == 0)) {
      sVar2 = mbedtls_mpi_size(&ctx->P);
      ctx->len = sVar2;
      iVar1 = 0;
    }
    else {
      iVar1 = iVar1 + -0x3580;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_set_group( mbedtls_dhm_context *ctx,
                           const mbedtls_mpi *P,
                           const mbedtls_mpi *G )
{
    int ret;

    if( ctx == NULL || P == NULL || G == NULL )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = mbedtls_mpi_copy( &ctx->P, P ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &ctx->G, G ) ) != 0 )
    {
        return( MBEDTLS_ERR_DHM_SET_GROUP_FAILED + ret );
    }

    ctx->len = mbedtls_mpi_size( &ctx->P );
    return( 0 );
}